

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.cpp
# Opt level: O2

bool __thiscall Entity::logic(Entity *this,int step)

{
  int iVar1;
  ResourceManager *this_00;
  Player *this_01;
  
  iVar1 = this->hp;
  if (iVar1 < 1) {
    (*this->_vptr_Entity[3])(this);
    this_00 = ResourceManager::getInstance();
    this_01 = (Player *)ResourceManager::getData(this_00,1);
    Player::addScore(this_01,this->points);
  }
  else if (0 < this->hilightCount) {
    this->hilightCount = this->hilightCount - step;
  }
  return 0 < iVar1;
}

Assistant:

bool Entity::logic(int step)
{
   if (hp <= 0) {
      spawn();
      ResourceManager& rm = ResourceManager::getInstance();
      Player *p = (Player *)rm.getData(RES_PLAYER);
      p->addScore(points);
      return false;
   }
   
   if (hilightCount > 0) {
      hilightCount -= step;
   }

   return true;
}